

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_test.cc
# Opt level: O1

void __thiscall PageHeapTest_Stats_Test::TestBody(PageHeapTest_Stats_Test *this)

{
  SpinLockHolder ptr;
  PageHeap *this_00;
  Span *span;
  Span *span_00;
  bool bVar1;
  SpinLockHolder local_28;
  SpinLockHolder l;
  unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_> ph;
  
  this_00 = (PageHeap *)operator_new(0x1830e0);
  tcmalloc::PageHeap::PageHeap(this_00,1);
  l.lock_ = (SpinLock *)this_00;
  CheckStats(this_00,0,0,0);
  span = tcmalloc::PageHeap::NewWithSizeClass((PageHeap *)l.lock_,0x100,0);
  CheckStats((PageHeap *)l.lock_,0x100,0,0);
  span_00 = tcmalloc::PageHeap::SplitForTest((PageHeap *)l.lock_,span,0x80);
  tcmalloc::PageHeap::Delete((PageHeap *)l.lock_,span_00);
  CheckStats((PageHeap *)l.lock_,0x100,0x80,0);
  local_28.lock_ = l.lock_ + 2;
  LOCK();
  bVar1 = l.lock_[2].lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar1) {
    l.lock_[2].lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar1) {
    SpinLock::SlowLock(local_28.lock_);
  }
  tcmalloc::PageHeap::ReleaseAtLeastNPages((PageHeap *)l.lock_,1);
  SpinLockHolder::~SpinLockHolder(&local_28);
  CheckStats((PageHeap *)l.lock_,0x100,0,0x80);
  tcmalloc::PageHeap::Delete((PageHeap *)l.lock_,span);
  CheckStats((PageHeap *)l.lock_,0x100,0x80,0x80);
  ptr = l;
  if (l.lock_ != (SpinLock *)0x0) {
    std::
    _Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
    ::~_Rb_tree((_Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
                 *)(l.lock_ + 0x60012));
    std::
    _Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
    ::~_Rb_tree((_Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
                 *)(ptr.lock_ + 0x60006));
    operator_delete(ptr.lock_,0x1830e0);
  }
  return;
}

Assistant:

TEST(PageHeapTest, Stats) {
  std::unique_ptr<tcmalloc::PageHeap> ph(new tcmalloc::PageHeap());

  // Empty page heap
  CheckStats(ph.get(), 0, 0, 0);

  // Allocate a span 's1'
  tcmalloc::Span* s1 = ph->New(256);
  CheckStats(ph.get(), 256, 0, 0);

  // Split span 's1' into 's1', 's2'.  Delete 's2'
  tcmalloc::Span* s2 = ph->SplitForTest(s1, 128);
  ph->Delete(s2);
  CheckStats(ph.get(), 256, 128, 0);

  // Unmap deleted span 's2'
  {
      SpinLockHolder l(ph->pageheap_lock());
      ph->ReleaseAtLeastNPages(1);
  }
  CheckStats(ph.get(), 256, 0, 128);

  // Delete span 's1'
  ph->Delete(s1);
  CheckStats(ph.get(), 256, 128, 128);
}